

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::SubDataToUndefinedCase::SubDataToUndefinedCase
          (SubDataToUndefinedCase *this,Context *context,char *name,char *desc,deUint32 target,
          deUint32 usage,int size,IVec2 *ranges,int numRanges,VerifyType verify)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  allocator<tcu::Vector<int,_2>_> local_31;
  deUint32 local_30;
  deUint32 local_2c;
  deUint32 usage_local;
  deUint32 target_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  SubDataToUndefinedCase *this_local;
  
  local_30 = usage;
  local_2c = target;
  _usage_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext((Context *)name_local);
  deqp::gls::BufferTestUtil::BufferCase::BufferCase
            (&this->super_BufferCase,testCtx,renderCtx,desc_local,_usage_local);
  (this->super_BufferCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SubDataToUndefinedCase_015ab768;
  this->m_target = local_2c;
  this->m_usage = local_30;
  this->m_size = size;
  std::allocator<tcu::Vector<int,_2>_>::allocator(&local_31);
  std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
  vector<tcu::Vector<int,2>const*,void>
            ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&this->m_ranges,ranges
             ,ranges + numRanges,&local_31);
  std::allocator<tcu::Vector<int,_2>_>::~allocator(&local_31);
  this->m_verify = verify;
  return;
}

Assistant:

SubDataToUndefinedCase (Context& context, const char* name, const char* desc, deUint32 target, deUint32 usage, int size, const tcu::IVec2* ranges, int numRanges, VerifyType verify)
		: BufferCase	(context.getTestContext(), context.getRenderContext(), name, desc)
		, m_target		(target)
		, m_usage		(usage)
		, m_size		(size)
		, m_ranges		(ranges, ranges+numRanges)
		, m_verify		(verify)
	{
	}